

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O3

void Abc_NtkFraigStoreCheck(Abc_Ntk_t *pFraig)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar10;
  long lVar11;
  long local_58;
  ulong uVar9;
  
  iVar6 = pFraig->vPos->nSize;
  uVar5 = Abc_FrameReadStoreSize();
  uVar7 = (long)iVar6 / (long)(int)uVar5;
  if (iVar6 % (int)uVar5 != 0) {
    __assert_fail("nPoFinal % nStored == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFraig.c"
                  ,0x31c,"void Abc_NtkFraigStoreCheck(Abc_Ntk_t *)");
  }
  iVar6 = (int)uVar7;
  uVar7 = uVar7 & 0xffffffff;
  if (0 < iVar6) {
    lVar1 = uVar7 * 8;
    uVar9 = 0;
    local_58 = lVar1;
    do {
      if ((long)pFraig->vPos->nSize <= (long)uVar9) {
LAB_002ca0e1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar2 = uVar9 + 1;
      if (1 < (int)uVar5) {
        plVar3 = (long *)pFraig->vPos->pArray[uVar9];
        lVar4 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        uVar10 = 1;
        lVar11 = local_58;
        do {
          uVar8 = (int)uVar9 + iVar6;
          uVar9 = (ulong)uVar8;
          if (((int)uVar8 < 0) || (pFraig->vPos->nSize <= (int)uVar8)) goto LAB_002ca0e1;
          plVar3 = *(long **)((long)pFraig->vPos->pArray + lVar11);
          if (lVar4 != *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                (long)*(int *)plVar3[4] * 8)) {
            printf("Verification for PO #%d of network #%d has failed. The PO function is not used.\n"
                   ,uVar2,(ulong)((int)uVar10 + 1));
          }
          lVar11 = lVar11 + lVar1;
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
      }
      local_58 = local_58 + 8;
      uVar9 = uVar2;
    } while (uVar2 != uVar7);
  }
  return;
}

Assistant:

void Abc_NtkFraigStoreCheck( Abc_Ntk_t * pFraig )
{
    Abc_Obj_t * pNode0, * pNode1;
    int nPoOrig, nPoFinal, nStored; 
    int i, k;
    // check that the PO functions are correct
    nPoFinal = Abc_NtkPoNum(pFraig);
    nStored  = Abc_FrameReadStoreSize();
    assert( nPoFinal % nStored == 0 );
    nPoOrig  = nPoFinal / nStored;
    for ( i = 0; i < nPoOrig; i++ )
    {
        pNode0 = Abc_ObjFanin0( Abc_NtkPo(pFraig, i) ); 
        for ( k = 1; k < nStored; k++ )
        {
            pNode1 = Abc_ObjFanin0( Abc_NtkPo(pFraig, k*nPoOrig+i) ); 
            if ( pNode0 != pNode1 )
                printf( "Verification for PO #%d of network #%d has failed. The PO function is not used.\n", i+1, k+1 );
        }
    }
}